

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall QFormLayoutPrivate::updateSizes(QFormLayoutPrivate *this)

{
  QLayout *this_00;
  QFormLayoutItem *item;
  QFormLayoutItem *item_00;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  RowWrapPolicy RVar5;
  FieldGrowthPolicy FVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  QFlagsStorage<QSizePolicy::ControlType> controls1;
  QWidget *this_01;
  QStyle *this_02;
  pointer ppQVar11;
  QFormLayoutItem *pQVar12;
  uint uVar13;
  ulong uVar14;
  QFormLayoutItem *pQVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  QFlagsStorage<QSizePolicy::ControlType> local_9c;
  uint local_98;
  QFlagsStorage<QSizePolicy::ControlType> local_94;
  QFlagsStorage<QSizePolicy::ControlType> local_8c;
  int local_88;
  QFlagsStorage<QSizePolicy::ControlType> local_84;
  uint local_80;
  int local_7c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  
  uVar8 = *(uint *)&this->field_0xb0;
  if ((uVar8 & 0x300000) != 0) {
    this_00 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
    RVar5 = QFormLayout::rowWrapPolicy((QFormLayout *)this_00);
    uVar14 = (this->m_matrix).m_storage.d.size;
    this->field_0xb2 = this->field_0xb2 & 0xfc;
    this_01 = QLayout::parentWidget(this_00);
    if (this_01 == (QWidget *)0x0) {
      this_02 = (QStyle *)0x0;
    }
    else {
      this_02 = QWidget::style(this_01);
    }
    local_98 = *(uint *)(*(long *)&this_00->field_0x8 + 0x164);
    if ((int)local_98 < 0) {
      local_98 = qSmartSpacing(this_00,PM_LayoutVerticalSpacing);
    }
    local_68 = 0;
    local_80 = 0;
    if ((RVar5 != WrapAllRows) &&
       (local_80 = *(uint *)(*(long *)&this_00->field_0x8 + 0x160), (int)local_80 < 0)) {
      local_80 = qSmartSpacing(this_00,PM_LayoutHorizontalSpacing);
    }
    local_64 = 0;
    local_7c = 0;
    local_60 = 0;
    local_5c = 0;
    local_88 = 0;
    uVar8 = 0;
    uVar7 = 0;
    uVar13 = (uint)(uVar14 >> 1);
    if (0 < (int)uVar13) {
      bVar18 = (int)(local_80 | local_98) < 0;
      bVar17 = this_02 != (QStyle *)0x0;
      uVar14 = (ulong)(uVar13 & 0x7fffffff);
      lVar16 = 0;
      bVar2 = 0;
      bVar1 = 0;
      pQVar12 = (QFormLayoutItem *)0x0;
      pQVar15 = (QFormLayoutItem *)0x0;
      local_88 = 0;
      local_5c = 0;
      local_60 = 0;
      local_7c = 0;
      local_64 = 0;
      local_68 = 0;
      do {
        ppQVar11 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
        item = *(QFormLayoutItem **)((long)ppQVar11 + lVar16);
        ppQVar11 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
        item_00 = *(QFormLayoutItem **)((long)ppQVar11 + lVar16 + 8);
        if (item != (QFormLayoutItem *)0x0 || item_00 != (QFormLayoutItem *)0x0) {
          uVar8 = local_80;
          if (item == (QFormLayoutItem *)0x0) {
            if (item_00 != (QFormLayoutItem *)0x0) {
              FVar6 = QFormLayout::fieldGrowthPolicy((QFormLayout *)this_00);
              updateFormLayoutItem(item_00,local_98,FVar6,item_00->fullRow);
              if (item_00->fullRow != false) {
                uVar8 = 0;
              }
              goto LAB_0039944a;
            }
            if (!bVar17 || !bVar18) {
              pQVar15 = (QFormLayoutItem *)0x0;
              pQVar12 = (QFormLayoutItem *)0x0;
              goto LAB_0039982b;
            }
            if (-1 < (int)local_98) goto LAB_00399760;
            local_8c.i = 1;
            local_9c.i = 1;
LAB_00399537:
            if (RVar5 != WrapAllRows) {
              if (pQVar12 == (QFormLayoutItem *)0x0) {
                pQVar12 = pQVar15;
              }
              local_94.i = 1;
              local_84.i = 1;
              if (pQVar12 != (QFormLayoutItem *)0x0) {
                local_84.i = (*pQVar12->item->_vptr_QLayoutItem[0x10])();
              }
              if (pQVar15 != (QFormLayoutItem *)0x0) {
                local_94.i = (*pQVar15->item->_vptr_QLayoutItem[0x10])();
              }
              pQVar12 = item_00;
              if ((item == (QFormLayoutItem *)0x0) ||
                 (bVar3 = QFormLayoutItem::isHidden(item), bVar3)) {
                if ((item_00 == (QFormLayoutItem *)0x0) ||
                   (bVar3 = QFormLayoutItem::isHidden(item_00), bVar3)) goto LAB_00399760;
                if (item != (QFormLayoutItem *)0x0) goto LAB_00399714;
                iVar9 = QStyle::combinedLayoutSpacing
                                  (this_02,(ControlTypes)local_84.i,(ControlTypes)local_8c.i,
                                   Vertical,(QStyleOption *)0x0,this_01);
                iVar10 = QStyle::combinedLayoutSpacing
                                   (this_02,(ControlTypes)local_94.i,(ControlTypes)local_8c.i,
                                    Vertical,(QStyleOption *)0x0,this_01);
                if (iVar10 < iVar9) {
                  iVar10 = iVar9;
                }
              }
              else {
                iVar9 = QStyle::combinedLayoutSpacing
                                  (this_02,(ControlTypes)local_84.i,(ControlTypes)local_9c.i,
                                   Vertical,(QStyleOption *)0x0,this_01);
                if (item_00 == (QFormLayoutItem *)0x0) {
                  iVar10 = QStyle::combinedLayoutSpacing
                                     (this_02,(ControlTypes)local_94.i,(ControlTypes)local_9c.i,
                                      Vertical,(QStyleOption *)0x0,this_01);
                  pQVar12 = item;
                  if (iVar10 < iVar9) {
                    iVar10 = iVar9;
                  }
                }
                else {
                  item->vSpace = iVar9;
                  bVar3 = QFormLayoutItem::isHidden(item_00);
                  if (bVar3) goto LAB_00399760;
LAB_00399714:
                  iVar10 = QStyle::combinedLayoutSpacing
                                     (this_02,(ControlTypes)local_94.i,(ControlTypes)local_8c.i,
                                      Vertical,(QStyleOption *)0x0,this_01);
                }
              }
              pQVar12->vSpace = iVar10;
              goto LAB_00399760;
            }
            if (pQVar15 != (QFormLayoutItem *)0x0) {
              pQVar12 = pQVar15;
            }
            pQVar15 = pQVar12;
            if (item != (QFormLayoutItem *)0x0) {
              pQVar15 = item;
            }
            local_94.i = 1;
            controls1.i = 1;
            if (pQVar12 != (QFormLayoutItem *)0x0) {
              controls1.i = (*pQVar12->item->_vptr_QLayoutItem[0x10])();
            }
            if (pQVar15 != (QFormLayoutItem *)0x0) {
              local_94.i = (*pQVar15->item->_vptr_QLayoutItem[0x10])();
            }
            if (item != (QFormLayoutItem *)0x0 && pQVar12 != (QFormLayoutItem *)0x0) {
              iVar10 = QStyle::combinedLayoutSpacing
                                 (this_02,(ControlTypes)controls1.i,(ControlTypes)local_9c.i,
                                  Vertical,(QStyleOption *)0x0,this_01);
              item->vSpace = iVar10;
            }
            if ((item_00 != (QFormLayoutItem *)0x0) && (pQVar15 != (QFormLayoutItem *)0x0)) {
              iVar10 = QStyle::combinedLayoutSpacing
                                 (this_02,(ControlTypes)local_94.i,(ControlTypes)local_8c.i,Vertical
                                  ,(QStyleOption *)0x0,this_01);
              item_00->vSpace = iVar10;
            }
LAB_003997aa:
            if (item != (QFormLayoutItem *)0x0) {
LAB_003997af:
              iVar10 = (item->minSize).wd.m_i;
              if (local_88 <= iVar10) {
                local_88 = iVar10;
              }
              iVar10 = (item->sizeHint).wd.m_i;
              if (local_5c <= iVar10) {
                local_5c = iVar10;
              }
            }
            if (item_00 == (QFormLayoutItem *)0x0) {
              pQVar15 = (QFormLayoutItem *)0x0;
              pQVar12 = item;
              goto LAB_0039982b;
            }
            bVar4 = item_00->fullRow;
          }
          else {
            FVar6 = QFormLayout::fieldGrowthPolicy((QFormLayout *)this_00);
            updateFormLayoutItem(item,local_98,FVar6,false);
            if (item->isHfw == true) {
              *(uint *)&this->field_0xb0 = *(uint *)&this->field_0xb0 & 0xfffcffff | 0x10000;
            }
            uVar7 = (*item->item->_vptr_QLayoutItem[5])();
            if ((uVar7 & 2) != 0) {
              bVar1 = 1;
            }
            if ((uVar7 & 1) != 0) {
              bVar2 = 1;
            }
            if (item_00 == (QFormLayoutItem *)0x0) {
              if (bVar17 && bVar18) {
LAB_003994c6:
                local_9c.i = (*item->item->_vptr_QLayoutItem[0x10])();
                if (item_00 != (QFormLayoutItem *)0x0) goto LAB_003994dd;
                if ((int)local_98 < 0) {
                  local_8c.i = 1;
                  goto LAB_00399537;
                }
                goto LAB_00399760;
              }
              goto LAB_003997af;
            }
            FVar6 = QFormLayout::fieldGrowthPolicy((QFormLayout *)this_00);
            updateFormLayoutItem(item_00,local_98,FVar6,false);
LAB_0039944a:
            item_00->sbsHSpace = uVar8;
            if (item_00->isHfw == true) {
              *(uint *)&this->field_0xb0 = *(uint *)&this->field_0xb0 & 0xfffcffff | 0x10000;
            }
            uVar8 = (*item_00->item->_vptr_QLayoutItem[5])();
            if ((uVar8 & 2) != 0) {
              bVar1 = 1;
            }
            if ((uVar8 & 1) != 0) {
              bVar2 = 1;
            }
            if (!bVar17 || !bVar18) goto LAB_003997aa;
            if (item != (QFormLayoutItem *)0x0) goto LAB_003994c6;
            local_9c.i = 1;
LAB_003994dd:
            local_8c.i = (*item_00->item->_vptr_QLayoutItem[0x10])();
            if ((int)local_98 < 0) goto LAB_00399537;
LAB_00399760:
            if (-1 < (int)local_80 || RVar5 == WrapAllRows) goto LAB_003997aa;
            if (item != (QFormLayoutItem *)0x0) {
              if (item_00 == (QFormLayoutItem *)0x0) goto LAB_003997af;
LAB_00399785:
              iVar10 = QStyle::combinedLayoutSpacing
                                 (this_02,(ControlTypes)0x40,(ControlTypes)0x100,Horizontal,
                                  (QStyleOption *)0x0,this_01);
              item_00->sbsHSpace = iVar10;
              goto LAB_003997aa;
            }
            bVar4 = item_00->fullRow;
            if ((~bVar4 & item_00 != (QFormLayoutItem *)0x0) != 0) goto LAB_00399785;
          }
          iVar10 = (item_00->minSize).wd.m_i;
          pQVar15 = item_00;
          if ((bVar4 & 1) == 0) {
            iVar10 = iVar10 + item_00->sbsHSpace;
            if (local_60 <= iVar10) {
              local_60 = iVar10;
            }
            iVar10 = item_00->sbsHSpace + (item_00->sizeHint).wd.m_i;
            pQVar12 = item;
            if (local_7c <= iVar10) {
              local_7c = iVar10;
            }
          }
          else {
            if (local_64 <= iVar10) {
              local_64 = iVar10;
            }
            iVar10 = (item_00->sizeHint).wd.m_i;
            pQVar12 = item;
            if (local_68 <= iVar10) {
              local_68 = iVar10;
            }
          }
        }
LAB_0039982b:
        lVar16 = lVar16 + 0x10;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
      uVar8 = (uint)bVar1 << 0x16;
      uVar7 = (uint)bVar2 << 0x17;
    }
    if (RVar5 == WrapAllRows) {
      if (local_7c < local_68) {
        local_7c = local_68;
      }
      if (local_7c < local_5c) {
        local_7c = local_5c;
      }
      this->sh_width = local_7c;
      if (local_60 < local_64) {
        local_60 = local_64;
      }
      if (local_60 < local_88) {
        local_60 = local_88;
      }
      this->min_width = local_60;
      local_5c = 0;
    }
    else {
      iVar10 = local_7c + local_5c;
      if (local_7c + local_5c <= local_68) {
        iVar10 = local_68;
      }
      this->sh_width = iVar10;
      if (RVar5 == DontWrapRows) {
        iVar10 = local_60 + local_88;
        if (local_60 + local_88 <= local_64) {
          iVar10 = local_64;
        }
        this->min_width = iVar10;
        local_5c = 0xffffff;
      }
      else {
        if (local_64 <= local_60) {
          local_64 = local_60;
        }
        if (local_64 < local_88) {
          local_64 = local_88;
        }
        this->min_width = local_64;
        local_5c = local_5c + local_60;
      }
    }
    this->thresh_width = local_5c;
    uVar8 = uVar8 | uVar7 | *(uint *)&this->field_0xb0 & 0xff3fffff;
  }
  *(uint *)&this->field_0xb0 = uVar8 & 0xffcfffff;
  return;
}

Assistant:

void QFormLayoutPrivate::updateSizes()
{
    Q_Q(QFormLayout);

    if (sizesDirty) {
        QFormLayout::RowWrapPolicy wrapPolicy = q->rowWrapPolicy();
        bool wrapAllRows = (wrapPolicy == QFormLayout::WrapAllRows);
        bool dontWrapRows = (wrapPolicy == QFormLayout::DontWrapRows);
        int rr = m_matrix.rowCount();

        has_hfw = false;

        // If any control can expand, so can this layout
        // Wrapping doesn't affect expansion, though, just the minsize
        bool expandH = false;
        bool expandV = false;

        QFormLayoutItem *prevLbl = nullptr;
        QFormLayoutItem *prevFld = nullptr;

        QWidget *parent = q->parentWidget();
        QStyle *style = parent ? parent->style() : nullptr;

        int userVSpacing = q->verticalSpacing();
        int userHSpacing = wrapAllRows ? 0 : q->horizontalSpacing();

        int maxMinLblWidth = 0;
        int maxMinFldWidth = 0; // field with label
        int maxMinIfldWidth = 0; // independent field

        int maxShLblWidth = 0;
        int maxShFldWidth = 0;
        int maxShIfldWidth = 0;

        for (int i = 0; i < rr; ++i) {
            QFormLayoutItem *label = m_matrix(i, 0);
            QFormLayoutItem *field = m_matrix(i, 1);

            // Skip empty rows
            if (!label && !field)
                continue;

            if (label) {
                updateFormLayoutItem(label, userVSpacing, q->fieldGrowthPolicy(), false);
                if (label->isHfw)
                    has_hfw = true;
                Qt::Orientations o = label->expandingDirections();

                if (o & Qt::Vertical)
                    expandV = true;
                if (o & Qt::Horizontal)
                    expandH = true;
            }
            if (field) {
                updateFormLayoutItem(field, userVSpacing, q->fieldGrowthPolicy(), !label && field->fullRow);
                field->sbsHSpace = (!label && field->fullRow) ? 0 : userHSpacing;
                if (field->isHfw)
                    has_hfw = true;

                Qt::Orientations o = field->expandingDirections();

                if (o & Qt::Vertical)
                    expandV = true;
                if (o & Qt::Horizontal)
                    expandH = true;
            }

            // See if we need to calculate default spacings
            if ((userHSpacing < 0 || userVSpacing < 0) && style) {
                QSizePolicy::ControlTypes lbltypes =
                    QSizePolicy::ControlTypes(label ? label->controlTypes() : QSizePolicy::DefaultType);
                QSizePolicy::ControlTypes fldtypes =
                    QSizePolicy::ControlTypes(field ? field->controlTypes() : QSizePolicy::DefaultType);

                // VSpacing
                if (userVSpacing < 0) {
                    if (wrapAllRows) {
                        // label spacing is to a previous item
                        QFormLayoutItem *lbltop = prevFld ? prevFld : prevLbl;
                        // field spacing is to the label (or a previous item)
                        QFormLayoutItem *fldtop = label ? label : lbltop;
                        QSizePolicy::ControlTypes lbltoptypes =
                            QSizePolicy::ControlTypes(lbltop ? lbltop->controlTypes() : QSizePolicy::DefaultType);
                        QSizePolicy::ControlTypes fldtoptypes =
                            QSizePolicy::ControlTypes(fldtop ? fldtop->controlTypes() : QSizePolicy::DefaultType);
                        if (label && lbltop)
                            label->vSpace = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                        if (field && fldtop)
                            field->vSpace = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                    } else {
                        // Side by side..  we have to also consider the spacings to empty cells, which can strangely be more than
                        // non empty cells..
                        QFormLayoutItem *lbltop = prevLbl ? prevLbl : prevFld;
                        QFormLayoutItem *fldtop = prevFld;
                        QSizePolicy::ControlTypes lbltoptypes =
                            QSizePolicy::ControlTypes(lbltop ? lbltop->controlTypes() : QSizePolicy::DefaultType);
                        QSizePolicy::ControlTypes fldtoptypes =
                            QSizePolicy::ControlTypes(fldtop ? fldtop->controlTypes() : QSizePolicy::DefaultType);

                        // To be compatible to QGridLayout, we have to compare solitary labels & fields with both predecessors
                        if (label && !label->isHidden()) {
                            if (!field) {
                                int lblspacing = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                                int fldspacing = style->combinedLayoutSpacing(fldtoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                                label->vSpace = qMax(lblspacing, fldspacing);
                            } else {
                                label->vSpace = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                            }
                        }

                        if (field && !field->isHidden()) {
                            // check spacing against both the previous label and field
                            if (!label) {
                                int lblspacing = style->combinedLayoutSpacing(lbltoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                                int fldspacing = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                                field->vSpace = qMax(lblspacing, fldspacing);
                            } else {
                                field->vSpace = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                            }
                        }
                    }
                }

                // HSpacing
                // hard-coded the left and right control types so that all the rows have the same
                // inter-column spacing (otherwise the right column isn't always left aligned)
                if (userHSpacing < 0 && !wrapAllRows && (label || !field->fullRow) && field)
                    field->sbsHSpace = style->combinedLayoutSpacing(QSizePolicy::Label, QSizePolicy::LineEdit, Qt::Horizontal, nullptr, parent);
            }

            // Now update our min/sizehint widths
            // We choose to put the spacing in the field side in sbs, so
            // the right edge of the labels will align, but fields may
            // be a little ragged.. since different controls may have
            // different appearances, a slight raggedness in the left
            // edges of fields can be tolerated.
            // (Note - field->sbsHSpace is 0 for WrapAllRows mode)
            if (label) {
                maxMinLblWidth = qMax(maxMinLblWidth, label->minSize.width());
                maxShLblWidth = qMax(maxShLblWidth, label->sizeHint.width());
            }
            if (field) {
                if (field->fullRow) {
                    maxMinIfldWidth = qMax(maxMinIfldWidth, field->minSize.width());
                    maxShIfldWidth = qMax(maxShIfldWidth, field->sizeHint.width());
                } else {
                    maxMinFldWidth = qMax(maxMinFldWidth, field->minSize.width() + field->sbsHSpace);
                    maxShFldWidth = qMax(maxShFldWidth, field->sizeHint.width() + field->sbsHSpace);
                }
            }

            prevLbl = label;
            prevFld = field;
        }

        // Now, finally update the min/sizeHint widths
        if (wrapAllRows) {
            sh_width = qMax(maxShLblWidth, qMax(maxShIfldWidth, maxShFldWidth));
            min_width = qMax(maxMinLblWidth, qMax(maxMinIfldWidth, maxMinFldWidth));
            // in two line, we don't care as much about the threshold width
            thresh_width = 0;
        } else if (dontWrapRows) {
            // This is just the max widths glommed together
            sh_width = qMax(maxShLblWidth + maxShFldWidth, maxShIfldWidth);
            min_width = qMax(maxMinLblWidth + maxMinFldWidth, maxMinIfldWidth);
            thresh_width = QWIDGETSIZE_MAX;
        } else {
            // This is just the max widths glommed together
            sh_width = qMax(maxShLblWidth + maxShFldWidth, maxShIfldWidth);
            // min width needs to be the min when everything is wrapped,
            // otherwise we'll never get set with a width that causes wrapping
            min_width = qMax(maxMinLblWidth, qMax(maxMinIfldWidth, maxMinFldWidth));
            // We split a pair at label sh + field min (### for now..)
            thresh_width = maxShLblWidth + maxMinFldWidth;
        }

        // Update the expansions
        expandVertical = expandV;
        expandHorizontal = expandH;
    }
    sizesDirty = false;
}